

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O2

ostream * Catch::operator<<(ostream *os,SourceLineInfo *info)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)os,info->file);
  poVar1 = std::operator<<(poVar1,':');
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  return os;
}

Assistant:

std::ostream& operator << ( std::ostream& os, SourceLineInfo const& info ) {
#ifndef __GNUG__
        os << info.file << '(' << info.line << ')';
#else
        os << info.file << ':' << info.line;
#endif
        return os;
    }